

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPubkey
          (ExtPubkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  CfdException *this_00;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  DescriptorKeyReference *local_18;
  DescriptorKeyReference *this_local;
  
  local_18 = this;
  this_local = (DescriptorKeyReference *)__return_storage_ptr__;
  if (this->key_type_ == kDescriptorKeyBip32) {
    ExtPubkey::ExtPubkey(__return_storage_ptr__,&this->extpubkey_);
  }
  else {
    if (this->key_type_ != kDescriptorKeyBip32Priv) {
      local_30.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_30.filename = local_30.filename + 1;
      local_30.line = 0x1ac;
      local_30.funcname = "GetExtPubkey";
      logger::warn<>(&local_30,"Failed to GetExtPubkey. unsupported key type.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_50,"GetExtPubkey unsupported key type.",&local_51);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPrivkey::GetExtPubkey(__return_storage_ptr__,&this->extprivkey_);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey DescriptorKeyReference::GetExtPubkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32) {
    return extpubkey_;
  }
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_.GetExtPubkey();
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPubkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPubkey unsupported key type.");
}